

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

Dic<asl::String> __thiscall asl::String::split(String *this,String *sep1,String *sep2)

{
  char *pcVar1;
  String *pSVar2;
  int *in_RCX;
  uint j;
  char *__haystack;
  int *__needle;
  long lVar3;
  long lVar4;
  Array<asl::String> pairs;
  undefined1 local_70 [24];
  void *local_58;
  String local_48;
  
  local_70._8_8_ = this;
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this,0);
  split((String *)local_70,sep1);
  if (0 < *(int *)&((String *)(local_70._0_8_ + -0x18))->field_2) {
    lVar4 = 0;
    lVar3 = 0;
    pSVar2 = (String *)local_70._0_8_;
    do {
      __needle = in_RCX + 2;
      if (*in_RCX != 0) {
        __needle = *(int **)(in_RCX + 2);
      }
      if (*(int *)((long)&pSVar2->_size + lVar4) == 0) {
        __haystack = (pSVar2->field_2)._space + lVar4;
      }
      else {
        __haystack = *(char **)((long)&pSVar2->field_2 + lVar4);
      }
      pcVar1 = strstr(__haystack,(char *)__needle);
      j = -(uint)(pcVar1 == (char *)0x0) | (int)pcVar1 - (int)__haystack;
      if (0 < (int)j) {
        substring((String *)(local_70 + 0x10),(String *)((long)&pSVar2->_size + lVar4),in_RCX[1] + j
                  ,*(int *)((long)&pSVar2->_len + lVar4));
        substring(&local_48,(String *)((long)(int *)local_70._0_8_ + lVar4),0,j);
        pSVar2 = Map<asl::String,_asl::String>::operator[]
                           ((Map<asl::String,_asl::String> *)local_70._8_8_,&local_48);
        operator=(pSVar2,(String *)(local_70 + 0x10));
        if (local_48._size != 0) {
          ::free(local_48.field_2._str);
        }
        pSVar2 = (String *)local_70._0_8_;
        if (local_70._16_4_ != 0) {
          ::free(local_58);
          pSVar2 = (String *)local_70._0_8_;
        }
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < *(int *)&pSVar2[-1].field_2);
  }
  Array<asl::String>::~Array((Array<asl::String> *)local_70);
  return (Dic<asl::String>)(KeyVal *)local_70._8_8_;
}

Assistant:

Dic<String> String::split(const String& sep1, const String& sep2) const
{
	Dic<String> dic;
	Array<String> pairs = split(sep1);
	for (int i = 0; i < pairs.length(); i++)
	{
		int j = pairs[i].indexOf(sep2);
		if (j > 0)
			dic[pairs[i].substring(0, j)] = pairs[i].substring(j + sep2.length());
	}
	return dic;
}